

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  uint local_34;
  int off_x;
  int off_y;
  uint *out_pixel;
  char *in_str_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ImFontAtlas *atlas_local;
  
  out_pixel = atlas->TexPixelsRGBA32 + (long)x + (long)(y * atlas->TexWidth);
  in_str_local = in_str;
  for (off_y = 0; off_y < h; off_y = off_y + 1) {
    for (off_x = 0; off_x < w; off_x = off_x + 1) {
      if (in_str_local[off_x] == in_marker_char) {
        local_34 = in_marker_pixel_value;
      }
      else {
        local_34 = 0;
      }
      out_pixel[off_x] = local_34;
    }
    out_pixel = out_pixel + atlas->TexWidth;
    in_str_local = in_str_local + w;
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}